

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O3

int ImfHeaderStringAttribute(ImfHeader *hdr,char *name,char **value)

{
  TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pTVar1;
  
  pTVar1 = Imf_3_2::Header::typedAttribute<Imf_3_2::TypedAttribute<std::__cxx11::string>>
                     ((Header *)hdr,name);
  *value = (pTVar1->_value)._M_dataplus._M_p;
  return 1;
}

Assistant:

int
ImfHeaderStringAttribute (
    const ImfHeader* hdr, const char name[], const char** value)
{
    try
    {
        *value = header (hdr)
                     ->typedAttribute<
                         OPENEXR_IMF_INTERNAL_NAMESPACE::StringAttribute> (name)
                     .value ()
                     .c_str ();

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}